

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O0

void qsub(char *qtag,int flags)

{
  char *pcVar1;
  FILE *__stream;
  ushort **ppuVar2;
  char *pcVar3;
  uint in_ESI;
  char *in_RDI;
  bool bVar4;
  char *copy_of_set_dbase;
  char *qroot;
  char *mark;
  char *cptr;
  FILE *qfp;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar5;
  FILE *in_stack_ffffffffffffff90;
  uint local_64;
  char *local_28;
  char *local_20;
  int in_stack_fffffffffffffff0;
  
  qnum = atoi(in_RDI);
  if (qsub::line == (char *)0x0) {
    qsub::line = (char *)malloc(0x2000);
    qsub::qpath = (char *)malloc(0x2000);
    if (qsub::line == (char *)0x0) {
      fprintf(_stderr,"Malloc failed at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
              ,0x8b);
      exit(1);
    }
    if (qsub::qpath == (char *)0x0) {
      fprintf(_stderr,"Malloc failed at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
              ,0x8c);
      exit(1);
    }
  }
  pcVar1 = env_config((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)0x10502b);
  sprintf(qsub::qpath,"%s%c%s.sql",pcVar1,0x2f,in_RDI);
  __stream = fopen(qsub::qpath,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Open failed for %s at %s:%d\n",qsub::qpath,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/eyalroz[P]tpch-dbgen/src/qgen.c"
            ,0x93);
    exit(1);
  }
  rowcnt = rowcnt_dflt[qnum];
  varsub(in_ESI,in_stack_fffffffffffffff0,(int)((ulong)__stream >> 0x20));
  if ((in_ESI & 0x4000) != 0) {
    fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
  }
  do {
    pcVar1 = fgets(qsub::line,0x2000,__stream);
    if (pcVar1 == (char *)0x0) {
      fclose(__stream);
      fflush(_stdout);
      return;
    }
    if ((in_ESI & 0x800) == 0) {
      strip_comments((char *)in_stack_ffffffffffffff90);
    }
    local_28 = qsub::line;
LAB_00105146:
    while (pcVar1 = strchr(local_28,0x3a), pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      local_20 = pcVar1 + 1;
      fprintf(_stdout,"%s",local_28);
      switch(*local_20) {
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        atoi(local_20);
        varsub(in_ESI,in_stack_fffffffffffffff0,(int)((ulong)__stream >> 0x20));
        do {
          ppuVar2 = __ctype_b_loc();
          pcVar3 = local_20 + 1;
          pcVar1 = local_20 + 1;
          local_20 = pcVar3;
        } while (((*ppuVar2)[(int)*pcVar1] & 0x800) != 0);
        break;
      default:
        fprintf(_stderr,"-- unknown flag \'%c%c\' ignored\n",0x3a,(ulong)(uint)(int)*local_20);
        local_20 = pcVar1 + 2;
        break;
      case 'B':
      case 'b':
        if ((in_ESI & 0x200) == 0) {
          fprintf(_stdout,"%s\n","");
        }
        local_20 = pcVar1 + 2;
        break;
      case 'C':
      case 'c':
        if ((in_ESI & 8) != 0) {
          fprintf(_stdout,"CONNECT TO %s ;\n",db_name);
        }
        local_20 = pcVar1 + 2;
        break;
      case 'E':
      case 'e':
        if ((in_ESI & 0x200) == 0) {
          fprintf(_stdout,"%s\n","COMMIT WORK;");
        }
        local_20 = pcVar1 + 2;
        break;
      case 'N':
      case 'n':
        goto switchD_001051c4_caseD_4e;
      case 'O':
      case 'o':
        if ((in_ESI & 2) != 0) {
          if (snum < 0) {
            local_64 = 0;
          }
          else {
            local_64 = snum;
          }
          fprintf(_stdout,"%s \'%s/%s.%d\'","",osuff,in_RDI,(ulong)local_64);
        }
        local_20 = pcVar1 + 2;
        break;
      case 'Q':
      case 'q':
        fprintf(_stdout,"%s",in_RDI);
        local_20 = pcVar1 + 2;
        break;
      case 'S':
      case 's':
        uVar5 = snum;
        if (snum < 0) {
          uVar5 = 0;
        }
        in_stack_ffffffffffffff90 = _stdout;
        fprintf(_stdout,"%d",(ulong)uVar5);
        local_20 = pcVar1 + 2;
        break;
      case 'X':
      case 'x':
        if ((in_ESI & 4) != 0) {
          fprintf(_stdout,"%s\n","SET CURRENT EXPLAIN SNAPSHOT ON;");
        }
        local_20 = pcVar1 + 2;
      }
      local_28 = local_20;
    }
    fprintf(_stdout,"%s",local_28);
  } while( true );
switchD_001051c4_caseD_4e:
  if ((in_ESI & 0x4000) == 0) {
    local_20 = pcVar1 + 2;
    rowcnt = atoi(local_20);
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = true;
      if (((*ppuVar2)[(int)*local_20] & 0x800) == 0) {
        bVar4 = *local_20 == ' ';
      }
      if (!bVar4) break;
      local_20 = local_20 + 1;
    }
    fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
  }
  goto LAB_00105146;
}

Assistant:

void
qsub(char *qtag, int flags)
{
static char *line = NULL,
    *qpath = NULL;
FILE *qfp;
char *cptr,
    *mark,
    *qroot = NULL;

    qnum = atoi(qtag);
    if (line == NULL)
        {
        line = malloc(BUFSIZ);
        qpath = malloc(BUFSIZ);
        MALLOC_CHECK(line);
        MALLOC_CHECK(qpath);
        }

    qroot = env_config(QDIR_TAG, QDIR_DFLT);
    sprintf(qpath, "%s%c%s.sql", 
		qroot, PATH_SEP, qtag);
    qfp = fopen(qpath, "r");
    OPEN_CHECK(qfp, qpath);

    rowcnt = rowcnt_dflt[qnum];
    varsub(qnum, 0, flags); /* set the variables */
    if ((flags & DFLT_NUM) && (strlen(SET_ROWCOUNT) > 0))
        fprintf(ofp, SET_ROWCOUNT, rowcnt);
    while (fgets(line, BUFSIZ, qfp) != NULL)
        {
        if (!(flags & COMMENT))
            strip_comments(line);
        mark = line;
        while ((cptr = strchr(mark, VTAG)) != NULL)
            {
            *cptr = '\0';
             cptr++;
            fprintf(ofp,"%s", mark);
            switch(*cptr)
                {
                case 'b':
                case 'B':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", START_TRAN);
                    cptr++;
                    break;
                case 'c':
                case 'C':
                    if ((flags & DBASE) && (strlen(SET_DBASE) > 0))
						{
							// The following "useless" copy  helps us avoide 
							// a compiler warning in case SET_DBASE is empty;
							// the compiler may not notice this never gets
							// executed for an empty SET_DBASE.
							const char* copy_of_set_dbase = SET_DBASE;
	                        fprintf(ofp, copy_of_set_dbase, db_name);
						}
                    cptr++;
                    break;
                case 'e':
                case 'E':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", END_TRAN);
                    cptr++;
                    break;
                case 'n':
                case 'N':
                    if (!(flags & DFLT_NUM))
                        {
                        rowcnt=atoi(++cptr);
                        while (isdigit(*cptr) || *cptr == ' ') cptr++;
                        if (strlen(SET_ROWCOUNT) > 0)
                            fprintf(ofp, SET_ROWCOUNT, rowcnt);
                        }
                    continue;
                case 'o':
                case 'O':
                    if (flags & OUTPUT)
                        fprintf(ofp,"%s '%s/%s.%d'", SET_OUTPUT, osuff, 
                            qtag, (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'q':
                case 'Q':
                    fprintf(ofp,"%s", qtag);
                    cptr++;
                    break;
                case 's':
                case 'S':
                    fprintf(ofp,"%d", (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'X':
                case 'x':
                    if (flags & EXPLAIN)
                        fprintf(ofp, "%s\n", GEN_QUERY_PLAN);
                    cptr++;
                    break;
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
                    varsub(qnum, atoi(cptr), flags & DFLT);
                    while (isdigit(*++cptr));
                    break;
                default:
		    fprintf(stderr, "-- unknown flag '%c%c' ignored\n", 
                        VTAG, *cptr);
		    cptr++;
		    break;
                }
            mark=cptr;
            }
        fprintf(ofp,"%s", mark);
        }
    fclose(qfp);
    fflush(stdout);
    return;
}